

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_strings.hpp
# Opt level: O0

char * __thiscall
ELFIO::string_section_accessor_template<ELFIO::section>::get_string
          (string_section_accessor_template<ELFIO::section> *this,Elf_Word index)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong __n;
  char *__s;
  char *pcVar4;
  char *end;
  char *str;
  size_t remaining_size;
  size_t section_size;
  char *data;
  Elf_Word index_local;
  string_section_accessor_template<ELFIO::section> *this_local;
  ulong uVar3;
  
  if (this->string_section != (section *)0x0) {
    iVar1 = (*this->string_section->_vptr_section[0x18])();
    iVar2 = (*this->string_section->_vptr_section[0x13])();
    uVar3 = CONCAT44(extraout_var_00,iVar2);
    if ((uVar3 <= index) || (CONCAT44(extraout_var,iVar1) == 0)) {
      return (char *)0x0;
    }
    __n = uVar3 - index;
    if (uVar3 < __n) {
      return (char *)0x0;
    }
    __s = (char *)(CONCAT44(extraout_var,iVar1) + (ulong)index);
    pcVar4 = (char *)memchr(__s,0,__n);
    if ((pcVar4 != (char *)0x0) && (pcVar4 < __s + __n)) {
      return __s;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* get_string( Elf_Word index ) const
    {
        if ( string_section ) {
            const char* data = string_section->get_data();
            size_t      section_size =
                static_cast<size_t>( string_section->get_size() );

            // Check if index is within bounds
            if ( index >= section_size || nullptr == data ) {
                return nullptr;
            }

            // Check for integer overflow in size calculation
            size_t remaining_size = section_size - index;
            if ( remaining_size > section_size ) { // Check for underflow
                return nullptr;
            }

            // Use standard C++ functions to find string length
            const char* str = data + index;
            const char* end =
                (const char*)std::memchr( str, '\0', remaining_size );
            if ( end != nullptr && end < str + remaining_size ) {
                return str;
            }
        }

        return nullptr;
    }